

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O0

void player_handle_post_move(player *p,_Bool eval_trap,_Bool is_involuntary)

{
  loc_conflict grid;
  loc_conflict grid_00;
  loc_conflict grid_01;
  loc_conflict grid_02;
  loc_conflict grid_03;
  loc_conflict grid_04;
  loc_conflict grid_05;
  loc_conflict grid_06;
  _Bool _Var1;
  wchar_t index;
  _Bool is_involuntary_local;
  _Bool eval_trap_local;
  player *p_local;
  
  grid.x = (p->grid).x;
  grid.y = (p->grid).y;
  _Var1 = square_isshop((chunk *)cave,grid);
  if (_Var1) {
    _Var1 = player_is_shapechanged(p);
    if (_Var1) {
      grid_00.x = (p->grid).x;
      grid_00.y = (p->grid).y;
      index = square_shopnum((chunk *)cave,grid_00);
      _Var1 = index_is_home(index);
      if (!_Var1) {
        msg("There is a scream and the door slams shut!");
        return;
      }
    }
    disturb(p);
    if (is_involuntary) {
      cmdq_flush();
    }
    event_signal(EVENT_ENTER_STORE);
    event_remove_handler_type(EVENT_ENTER_STORE);
    event_signal(EVENT_USE_STORE);
    event_remove_handler_type(EVENT_USE_STORE);
    event_signal(EVENT_LEAVE_STORE);
    event_remove_handler_type(EVENT_LEAVE_STORE);
  }
  else {
    if (is_involuntary) {
      cmdq_flush();
    }
    grid_01.x = (p->grid).x;
    grid_01.y = (p->grid).y;
    square_know_pile((chunk *)cave,grid_01,(_func__Bool_object_ptr *)0x0);
  }
  grid_02.x = (p->grid).x;
  grid_02.y = (p->grid).y;
  _Var1 = square_istree((chunk *)cave,grid_02);
  if (_Var1) {
    _Var1 = flag_has_dbg((p->state).pflags,10,0x13,"p->state.pflags","(PF_WOODEN)");
    if ((((!_Var1) &&
         (_Var1 = flag_has_dbg((p->state).pflags,10,0x30,"p->state.pflags","(PF_WOODSMAN)"), !_Var1)
         ) && (_Var1 = flag_has_dbg((p->state).pflags,10,0x11,"p->state.pflags","(PF_FLYING)"),
              !_Var1)) &&
       (_Var1 = flag_has_dbg((p->state).pflags,10,0x16,"p->state.pflags","(PF_ELVEN)"), !_Var1)) {
      p->upkeep->energy_use = (uint)z_info->move_energy + p->upkeep->energy_use;
    }
  }
  else {
    grid_03.x = (p->grid).x;
    grid_03.y = (p->grid).y;
    _Var1 = square_isrubble((chunk *)cave,grid_03);
    if (((_Var1) &&
        (_Var1 = flag_has_dbg((p->state).pflags,10,0x17,"p->state.pflags","(PF_DWARVEN)"), !_Var1))
       && (_Var1 = flag_has_dbg((p->state).pflags,10,0x11,"p->state.pflags","(PF_FLYING)"), !_Var1))
    {
      p->upkeep->energy_use = (uint)z_info->move_energy + p->upkeep->energy_use;
    }
  }
  player->upkeep->update = player->upkeep->update | 1;
  if (((eval_trap) &&
      (grid_04.x = (p->grid).x, grid_04.y = (p->grid).y,
      _Var1 = square_isplayertrap((chunk *)cave,grid_04), _Var1)) &&
     (grid_05.x = (p->grid).x, grid_05.y = (p->grid).y,
     _Var1 = square_isdisabledtrap((chunk *)cave,grid_05), !_Var1)) {
    grid_06.x = (p->grid).x;
    grid_06.y = (p->grid).y;
    hit_trap(grid_06,L'\0');
  }
  update_view(cave,p);
  search(p);
  return;
}

Assistant:

void player_handle_post_move(struct player *p, bool eval_trap,
		bool is_involuntary)
{
	/* Handle store doors, or notice objects */
	if (square_isshop(cave, p->grid)) {
		if ((player_is_shapechanged(p) &&
			 !index_is_home(square_shopnum(cave, p->grid)))) {
			msg("There is a scream and the door slams shut!");
			return;
		}
		disturb(p);
		if (is_involuntary) {
			cmdq_flush();
		}
		event_signal(EVENT_ENTER_STORE);
		event_remove_handler_type(EVENT_ENTER_STORE);
		event_signal(EVENT_USE_STORE);
		event_remove_handler_type(EVENT_USE_STORE);
		event_signal(EVENT_LEAVE_STORE);
		event_remove_handler_type(EVENT_LEAVE_STORE);
	} else {
		if (is_involuntary) {
			cmdq_flush();
		}
		square_know_pile(cave, p->grid, NULL);
	}

	/* Some terrain types need special treatment */
	if (square_istree(cave, p->grid)) {
		/* Ents, elves, druids, rangers, flyers can move easily */
		if (!(player_has(p, PF_WOODEN) || player_has(p, PF_WOODSMAN) ||
			  player_has(p, PF_FLYING) || player_has(p, PF_ELVEN))) {
			p->upkeep->energy_use += z_info->move_energy;
		}
	} else if (square_isrubble(cave, p->grid)) {
		/* Dwarves, flyers can move easily */
		if (!(player_has(p, PF_DWARVEN) ||
			  player_has(p, PF_FLYING))) {
			p->upkeep->energy_use += z_info->move_energy;
		}
	}

	/* Speed or stealth may change */
	player->upkeep->update |= (PU_BONUS);

	/* Discover invisible traps, set off visible ones */
	if (eval_trap && square_isplayertrap(cave, p->grid)
			&& !square_isdisabledtrap(cave, p->grid)) {
		hit_trap(p->grid, 0);
	}

	/* Update view and search */
	update_view(cave, p);
	search(p);
}